

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::DuplicateNameChecker::visit(DuplicateNameChecker *this,Namespace *n)

{
  Identifier IVar1;
  bool bVar2;
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *this_00;
  reference this_01;
  StructDeclaration *pSVar3;
  reference this_02;
  UsingDeclaration *pUVar4;
  pointer pbVar5;
  reference this_03;
  ModuleBase *pMVar6;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *this_04;
  reference this_05;
  VariableDeclaration *pVVar7;
  reference this_06;
  NamespaceAliasDeclaration *pNVar8;
  reference this_07;
  Function *pFVar9;
  pool_ref<soul::AST::Function> *f;
  iterator __end2_5;
  iterator __begin2_5;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *__range2_5;
  pool_ref<soul::AST::NamespaceAliasDeclaration> *a;
  iterator __end2_4;
  iterator __begin2_4;
  vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
  *__range2_4;
  pool_ref<soul::AST::VariableDeclaration> *c;
  iterator __end2_3;
  iterator __begin2_3;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2_3;
  pool_ref<soul::AST::ModuleBase> *m;
  iterator __end2_2;
  iterator __begin2_2;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *__range2_2;
  pool_ref<soul::AST::UsingDeclaration> *u;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  *__range2_1;
  pool_ref<soul::AST::StructDeclaration> *s;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *__range2;
  DuplicateNameChecker duplicateNameChecker;
  Namespace *n_local;
  DuplicateNameChecker *this_local;
  
  duplicateNameChecker.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)n;
  ASTVisitor::visit(&this->super_ASTVisitor,n);
  soul::DuplicateNameChecker::DuplicateNameChecker((DuplicateNameChecker *)&__range2);
  this_00 = (vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
             *)((long)&duplicateNameChecker.names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[4].field_2 + 8);
  __end2 = std::
           vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
           ::begin(this_00);
  s = (pool_ref<soul::AST::StructDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
      ::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
                                *)&s);
    if (!bVar2) break;
    this_01 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
              ::operator*(&__end2);
    pSVar3 = pool_ref<soul::AST::StructDeclaration>::operator->(this_01);
    IVar1.name = (pSVar3->super_TypeDeclarationBase).name.name;
    pSVar3 = pool_ref<soul::AST::StructDeclaration>::operator->(this_01);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,
               &(pSVar3->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject
                .context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  pbVar5 = duplicateNameChecker.names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3;
  __end2_1 = std::
             vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
             ::begin((vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
                      *)&pbVar5->_M_string_length);
  u = (pool_ref<soul::AST::UsingDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
      ::end((vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
             *)&pbVar5->_M_string_length);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
                        *)&u);
    if (!bVar2) break;
    this_02 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
              ::operator*(&__end2_1);
    pUVar4 = pool_ref<soul::AST::UsingDeclaration>::operator->(this_02);
    IVar1.name = (pUVar4->super_TypeDeclarationBase).name.name;
    pUVar4 = pool_ref<soul::AST::UsingDeclaration>::operator->(this_02);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,
               &(pUVar4->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject
                .context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
    ::operator++(&__end2_1);
  }
  pbVar5 = duplicateNameChecker.names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xd;
  __end2_2 = std::
             vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             ::begin((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                      *)pbVar5);
  m = (pool_ref<soul::AST::ModuleBase> *)
      std::
      vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ::end((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             *)pbVar5);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
                        *)&m);
    if (!bVar2) break;
    this_03 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
              ::operator*(&__end2_2);
    pMVar6 = pool_ref<soul::AST::ModuleBase>::operator->(this_03);
    IVar1.name = (pMVar6->name).name;
    pMVar6 = pool_ref<soul::AST::ModuleBase>::operator->(this_03);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,&(pMVar6->super_ASTObject).context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
    ::operator++(&__end2_2);
  }
  this_04 = (vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             *)((long)&duplicateNameChecker.names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[0xd].field_2 + 8);
  __end2_3 = std::
             vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             ::begin(this_04);
  c = (pool_ref<soul::AST::VariableDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ::end(this_04);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                        *)&c);
    if (!bVar2) break;
    this_05 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
              ::operator*(&__end2_3);
    pVVar7 = pool_ref<soul::AST::VariableDeclaration>::operator->(this_05);
    IVar1.name = (pVVar7->name).name;
    pVVar7 = pool_ref<soul::AST::VariableDeclaration>::operator->(this_05);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,
               &(pVVar7->super_Statement).super_ASTObject.context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2_3);
  }
  pbVar5 = duplicateNameChecker.names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4;
  __end2_4 = std::
             vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
             ::begin((vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
                      *)pbVar5);
  a = (pool_ref<soul::AST::NamespaceAliasDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
      ::end((vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
             *)pbVar5);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_4,
                       (__normal_iterator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>_>
                        *)&a);
    if (!bVar2) break;
    this_06 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>_>
              ::operator*(&__end2_4);
    pNVar8 = pool_ref<soul::AST::NamespaceAliasDeclaration>::operator->(this_06);
    IVar1.name = (pNVar8->name).name;
    pNVar8 = pool_ref<soul::AST::NamespaceAliasDeclaration>::operator->(this_06);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,&(pNVar8->super_ASTObject).context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>_>
    ::operator++(&__end2_4);
  }
  pbVar5 = duplicateNameChecker.names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xc;
  __end2_5 = std::
             vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ::begin((vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                      *)&pbVar5->_M_string_length);
  f = (pool_ref<soul::AST::Function> *)
      std::
      vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
      ::end((vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             *)&pbVar5->_M_string_length);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_5,
                       (__normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                        *)&f);
    if (!bVar2) break;
    this_07 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
              ::operator*(&__end2_5);
    pFVar9 = pool_ref<soul::AST::Function>::operator->(this_07);
    IVar1.name = (pFVar9->name).name;
    pFVar9 = pool_ref<soul::AST::Function>::operator->(this_07);
    soul::DuplicateNameChecker::checkWithoutAdding<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,&pFVar9->nameLocation);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
    ::operator++(&__end2_5);
  }
  soul::DuplicateNameChecker::~DuplicateNameChecker((DuplicateNameChecker *)&__range2);
  return;
}

Assistant:

void visit (AST::Namespace& n) override
        {
            super::visit (n);

            soul::DuplicateNameChecker duplicateNameChecker;

            for (auto& s : n.structures)       duplicateNameChecker.check (s->name, s->context);
            for (auto& u : n.usings)           duplicateNameChecker.check (u->name, u->context);
            for (auto& m : n.subModules)       duplicateNameChecker.check (m->name, m->context);
            for (auto& c : n.constants)        duplicateNameChecker.check (c->name, c->context);
            for (auto& a : n.namespaceAliases) duplicateNameChecker.check (a->name, a->context);

            // (functions must be scanned last)
            for (auto& f : n.functions)     duplicateNameChecker.checkWithoutAdding (f->name, f->nameLocation);
        }